

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

bool __thiscall
absl::time_internal::cctz::TimeZoneInfo::GetTransitionType
          (TimeZoneInfo *this,int_fast32_t utc_offset,bool is_dst,string *abbr,uint_least8_t *index)

{
  string *this_00;
  pointer pTVar1;
  const_iterator __position;
  bool bVar2;
  iterator iVar3;
  ulong uVar4;
  size_type sVar5;
  long lVar6;
  ulong uVar7;
  
  this_00 = &this->abbreviations_;
  sVar5 = (this->abbreviations_)._M_string_length;
  lVar6 = 0x29;
  for (uVar4 = 0;
      pTVar1 = (this->transition_types_).
               super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
               ._M_impl.super__Vector_impl_data._M_start, uVar7 = sVar5,
      uVar4 != ((long)(this->transition_types_).
                      super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x30;
      uVar4 = uVar4 + 1) {
    bVar2 = std::operator==((this_00->_M_dataplus)._M_p +
                            *(byte *)((long)&pTVar1->utc_offset + lVar6),abbr);
    uVar7 = (ulong)*(byte *)((long)&pTVar1->utc_offset + lVar6);
    if (bVar2) {
      sVar5 = uVar7;
    }
    if (((*(int *)((long)pTVar1 + lVar6 + -0x29) == utc_offset) &&
        ((bool)*(char *)((long)pTVar1 + lVar6 + -1) == is_dst)) && (sVar5 == uVar7)) break;
    lVar6 = lVar6 + 0x30;
  }
  if (uVar7 < 0x100 && uVar4 < 0x100) {
    __position._M_current =
         (this->transition_types_).
         super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (((long)__position._M_current -
        (long)(this->transition_types_).
              super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x30 == uVar4) {
      iVar3 = std::
              vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
              ::_M_emplace_aux<>(&this->transition_types_,__position);
      (iVar3._M_current)->utc_offset = (int_least32_t)utc_offset;
      (iVar3._M_current)->is_dst = is_dst;
      if (uVar7 == (this->abbreviations_)._M_string_length) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this_00,abbr);
        std::__cxx11::string::append((ulong)this_00,'\x01');
      }
      (iVar3._M_current)->abbr_index = (uint_least8_t)uVar7;
    }
    *index = (uint_least8_t)uVar4;
  }
  return uVar7 < 0x100 && uVar4 < 0x100;
}

Assistant:

bool TimeZoneInfo::GetTransitionType(std::int_fast32_t utc_offset, bool is_dst,
                                     const std::string& abbr,
                                     std::uint_least8_t* index) {
  std::size_t type_index = 0;
  std::size_t abbr_index = abbreviations_.size();
  for (; type_index != transition_types_.size(); ++type_index) {
    const TransitionType& tt(transition_types_[type_index]);
    const char* tt_abbr = &abbreviations_[tt.abbr_index];
    if (tt_abbr == abbr) abbr_index = tt.abbr_index;
    if (tt.utc_offset == utc_offset && tt.is_dst == is_dst) {
      if (abbr_index == tt.abbr_index) break;  // reuse
    }
  }
  if (type_index > 255 || abbr_index > 255) {
    // No index space (8 bits) available for a new type or abbreviation.
    return false;
  }
  if (type_index == transition_types_.size()) {
    TransitionType& tt(*transition_types_.emplace(transition_types_.end()));
    tt.utc_offset = static_cast<std::int_least32_t>(utc_offset);
    tt.is_dst = is_dst;
    if (abbr_index == abbreviations_.size()) {
      abbreviations_.append(abbr);
      abbreviations_.append(1, '\0');
    }
    tt.abbr_index = static_cast<std::uint_least8_t>(abbr_index);
  }
  *index = static_cast<std::uint_least8_t>(type_index);
  return true;
}